

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Vec2 __thiscall tcu::getFloatChannelValueRange(tcu *this,ChannelType channelType)

{
  Vec2 VVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float local_1c;
  float local_18;
  float cMax;
  float cMin;
  ChannelType channelType_local;
  
  local_18 = 0.0;
  local_1c = 0.0;
  switch(channelType) {
  case SNORM_INT8:
  case SNORM_INT16:
  case SNORM_INT32:
  case SNORM_INT_1010102_REV:
    local_18 = -1.0;
    local_1c = 1.0;
    break;
  case UNORM_INT8:
  case UNORM_INT16:
  case UNORM_INT24:
  case UNORM_INT32:
  case UNORM_BYTE_44:
  case UNORM_SHORT_565:
  case UNORM_SHORT_555:
  case UNORM_SHORT_4444:
  case UNORM_SHORT_5551:
  case UNORM_SHORT_1555:
  case UNORM_INT_101010:
  case UNORM_INT_1010102_REV:
    local_18 = 0.0;
    local_1c = 1.0;
    break;
  case UNSIGNED_BYTE_44:
    local_18 = 0.0;
    local_1c = 15.0;
    break;
  default:
    break;
  case UNSIGNED_SHORT_4444:
    local_18 = 0.0;
    local_1c = 15.0;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    local_18 = 0.0;
    local_1c = 10000.0;
    break;
  case UNSIGNED_INT_999_E5_REV:
    local_18 = 0.0;
    local_1c = 100000.0;
    break;
  case SIGNED_INT8:
    local_18 = -128.0;
    local_1c = 127.0;
    break;
  case SIGNED_INT16:
    local_18 = -32768.0;
    local_1c = 32767.0;
    break;
  case SIGNED_INT32:
    local_18 = -2.1474836e+09;
    local_1c = 2.1474836e+09;
    break;
  case UNSIGNED_INT8:
    local_18 = 0.0;
    local_1c = 255.0;
    break;
  case UNSIGNED_INT16:
    local_18 = 0.0;
    local_1c = 65535.0;
    break;
  case UNSIGNED_INT24:
    local_18 = 0.0;
    local_1c = 16777215.0;
    break;
  case UNSIGNED_INT32:
    local_18 = 0.0;
    local_1c = 4.2949673e+09;
    break;
  case HALF_FLOAT:
    local_18 = -1000.0;
    local_1c = 1000.0;
    break;
  case FLOAT:
    local_18 = -100000.0;
    local_1c = 100000.0;
    break;
  case FLOAT64:
    local_18 = -100000.0;
    local_1c = 100000.0;
  }
  Vector<float,_2>::Vector((Vector<float,_2> *)this,local_18,local_1c);
  VVar1.m_data[1] = extraout_XMM0_Db;
  VVar1.m_data[0] = extraout_XMM0_Da;
  return (Vec2)VVar1.m_data;
}

Assistant:

static Vec2 getFloatChannelValueRange (TextureFormat::ChannelType channelType)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	float cMin = 0.0f;
	float cMax = 0.0f;

	switch (channelType)
	{
		// Signed normalized formats.
		case TextureFormat::SNORM_INT8:
		case TextureFormat::SNORM_INT16:
		case TextureFormat::SNORM_INT32:
		case TextureFormat::SNORM_INT_1010102_REV:			cMin = -1.0f;			cMax = 1.0f;			break;

		// Unsigned normalized formats.
		case TextureFormat::UNORM_INT8:
		case TextureFormat::UNORM_INT16:
		case TextureFormat::UNORM_INT24:
		case TextureFormat::UNORM_INT32:
		case TextureFormat::UNORM_BYTE_44:
		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNORM_SHORT_555:
		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNORM_SHORT_1555:
		case TextureFormat::UNORM_INT_101010:
		case TextureFormat::UNORM_INT_1010102_REV:			cMin = 0.0f;			cMax = 1.0f;			break;

		// Misc formats.
		case TextureFormat::SIGNED_INT8:					cMin = -128.0f;			cMax = 127.0f;			break;
		case TextureFormat::SIGNED_INT16:					cMin = -32768.0f;		cMax = 32767.0f;		break;
		case TextureFormat::SIGNED_INT32:					cMin = -2147483648.0f;	cMax = 2147483647.0f;	break;
		case TextureFormat::UNSIGNED_INT8:					cMin = 0.0f;			cMax = 255.0f;			break;
		case TextureFormat::UNSIGNED_INT16:					cMin = 0.0f;			cMax = 65535.0f;		break;
		case TextureFormat::UNSIGNED_INT24:					cMin = 0.0f;			cMax = 16777215.0f;		break;
		case TextureFormat::UNSIGNED_INT32:					cMin = 0.0f;			cMax = 4294967295.f;	break;
		case TextureFormat::HALF_FLOAT:						cMin = -1e3f;			cMax = 1e3f;			break;
		case TextureFormat::FLOAT:							cMin = -1e5f;			cMax = 1e5f;			break;
		case TextureFormat::FLOAT64:						cMin = -1e5f;			cMax = 1e5f;			break;
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	cMin = 0.0f;			cMax = 1e4f;			break;
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		cMin = 0.0f;			cMax = 1e5f;			break;
		case TextureFormat::UNSIGNED_BYTE_44:				cMin = 0.0f;			cMax = 15.f;			break;
		case TextureFormat::UNSIGNED_SHORT_4444:			cMin = 0.0f;			cMax = 15.f;			break;

		default:
			DE_ASSERT(false);
	}

	return Vec2(cMin, cMax);
}